

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O0

void __thiscall wasm::WasmBinaryWriter::writeDylinkSection(WasmBinaryWriter *this)

{
  BufferWithRandomAccess *pBVar1;
  bool bVar2;
  pointer pDVar3;
  size_type sVar4;
  string_view *psVar5;
  char *data;
  Name *neededDynlib;
  iterator __end2;
  iterator __begin2;
  vector<wasm::Name,_std::allocator<wasm::Name>_> *__range2;
  U32LEB local_38;
  U32LEB local_34;
  U32LEB local_30;
  int32_t local_2c;
  undefined1 auStack_28 [4];
  int32_t substart;
  int32_t local_14;
  WasmBinaryWriter *pWStack_10;
  int32_t start;
  WasmBinaryWriter *this_local;
  
  pWStack_10 = this;
  bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->wasm->dylinkSection);
  if (bVar2) {
    pDVar3 = std::unique_ptr<wasm::DylinkSection,_std::default_delete<wasm::DylinkSection>_>::
             operator->(&this->wasm->dylinkSection);
    if ((pDVar3->isLegacy & 1U) == 0) {
      local_14 = startSection<wasm::BinaryConsts::Section>(this,Custom);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)auStack_28,
                 BinaryConsts::CustomSections::Dylink0);
      writeInlineString(this,_auStack_28);
      local_2c = startSubsection(this,DylinkMemInfo);
      pBVar1 = this->o;
      pDVar3 = std::unique_ptr<wasm::DylinkSection,_std::default_delete<wasm::DylinkSection>_>::
               operator->(&this->wasm->dylinkSection);
      LEB<unsigned_int,_unsigned_char>::LEB(&local_30,pDVar3->memorySize);
      BufferWithRandomAccess::operator<<(pBVar1,local_30);
      pBVar1 = this->o;
      pDVar3 = std::unique_ptr<wasm::DylinkSection,_std::default_delete<wasm::DylinkSection>_>::
               operator->(&this->wasm->dylinkSection);
      LEB<unsigned_int,_unsigned_char>::LEB(&local_34,pDVar3->memoryAlignment);
      BufferWithRandomAccess::operator<<(pBVar1,local_34);
      pBVar1 = this->o;
      pDVar3 = std::unique_ptr<wasm::DylinkSection,_std::default_delete<wasm::DylinkSection>_>::
               operator->(&this->wasm->dylinkSection);
      LEB<unsigned_int,_unsigned_char>::LEB(&local_38,pDVar3->tableSize);
      BufferWithRandomAccess::operator<<(pBVar1,local_38);
      pBVar1 = this->o;
      pDVar3 = std::unique_ptr<wasm::DylinkSection,_std::default_delete<wasm::DylinkSection>_>::
               operator->(&this->wasm->dylinkSection);
      LEB<unsigned_int,_unsigned_char>::LEB
                ((LEB<unsigned_int,_unsigned_char> *)((long)&__range2 + 4),pDVar3->tableAlignment);
      BufferWithRandomAccess::operator<<(pBVar1,__range2._4_4_);
      finishSubsection(this,local_2c);
      pDVar3 = std::unique_ptr<wasm::DylinkSection,_std::default_delete<wasm::DylinkSection>_>::
               operator->(&this->wasm->dylinkSection);
      sVar4 = std::vector<wasm::Name,_std::allocator<wasm::Name>_>::size(&pDVar3->neededDynlibs);
      if (sVar4 != 0) {
        local_2c = startSubsection(this,DylinkNeeded);
        pBVar1 = this->o;
        pDVar3 = std::unique_ptr<wasm::DylinkSection,_std::default_delete<wasm::DylinkSection>_>::
                 operator->(&this->wasm->dylinkSection);
        sVar4 = std::vector<wasm::Name,_std::allocator<wasm::Name>_>::size(&pDVar3->neededDynlibs);
        LEB<unsigned_int,_unsigned_char>::LEB
                  ((LEB<unsigned_int,_unsigned_char> *)&__range2,(uint)sVar4);
        BufferWithRandomAccess::operator<<(pBVar1,__range2._0_4_);
        pDVar3 = std::unique_ptr<wasm::DylinkSection,_std::default_delete<wasm::DylinkSection>_>::
                 operator->(&this->wasm->dylinkSection);
        __end2 = std::vector<wasm::Name,_std::allocator<wasm::Name>_>::begin(&pDVar3->neededDynlibs)
        ;
        neededDynlib = (Name *)std::vector<wasm::Name,_std::allocator<wasm::Name>_>::end
                                         (&pDVar3->neededDynlibs);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end2,(__normal_iterator<wasm::Name_*,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>
                                           *)&neededDynlib), bVar2) {
          psVar5 = (string_view *)
                   __gnu_cxx::
                   __normal_iterator<wasm::Name_*,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>
                   ::operator*(&__end2);
          writeInlineString(this,*psVar5);
          __gnu_cxx::
          __normal_iterator<wasm::Name_*,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>::
          operator++(&__end2);
        }
        finishSubsection(this,local_2c);
      }
      pDVar3 = std::unique_ptr<wasm::DylinkSection,_std::default_delete<wasm::DylinkSection>_>::
               operator->(&this->wasm->dylinkSection);
      data = std::vector<char,_std::allocator<char>_>::data(&pDVar3->tail);
      pDVar3 = std::unique_ptr<wasm::DylinkSection,_std::default_delete<wasm::DylinkSection>_>::
               operator->(&this->wasm->dylinkSection);
      sVar4 = std::vector<char,_std::allocator<char>_>::size(&pDVar3->tail);
      writeData(this,data,sVar4);
      finishSection(this,local_14);
    }
    else {
      writeLegacyDylinkSection(this);
    }
  }
  return;
}

Assistant:

void WasmBinaryWriter::writeDylinkSection() {
  if (!wasm->dylinkSection) {
    return;
  }

  if (wasm->dylinkSection->isLegacy) {
    writeLegacyDylinkSection();
    return;
  }

  auto start = startSection(BinaryConsts::Custom);
  writeInlineString(BinaryConsts::CustomSections::Dylink0);

  auto substart =
    startSubsection(BinaryConsts::CustomSections::Subsection::DylinkMemInfo);
  o << U32LEB(wasm->dylinkSection->memorySize);
  o << U32LEB(wasm->dylinkSection->memoryAlignment);
  o << U32LEB(wasm->dylinkSection->tableSize);
  o << U32LEB(wasm->dylinkSection->tableAlignment);
  finishSubsection(substart);

  if (wasm->dylinkSection->neededDynlibs.size()) {
    substart =
      startSubsection(BinaryConsts::CustomSections::Subsection::DylinkNeeded);
    o << U32LEB(wasm->dylinkSection->neededDynlibs.size());
    for (auto& neededDynlib : wasm->dylinkSection->neededDynlibs) {
      writeInlineString(neededDynlib.str);
    }
    finishSubsection(substart);
  }

  writeData(wasm->dylinkSection->tail.data(), wasm->dylinkSection->tail.size());
  finishSection(start);
}